

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O2

bool QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::
     handleEvent<QWindowSystemInterfacePrivate::WindowDevicePixelRatioChangedEvent,QWindow*>
               (QWindow *args)

{
  long *plVar1;
  WindowDevicePixelRatioChangedEvent *this;
  
  this = (WindowDevicePixelRatioChangedEvent *)operator_new(0x28);
  QWindowSystemInterfacePrivate::WindowDevicePixelRatioChangedEvent::
  WindowDevicePixelRatioChangedEvent(this,args);
  QWindowSystemInterfacePrivate::WindowSystemEventList::append
            (&QWindowSystemInterfacePrivate::windowSystemEventQueue,(WindowSystemEvent *)this);
  if ((QCoreApplication::self != 0) &&
     (plVar1 = *(long **)(*(long *)(*(long *)(QCoreApplication::self + 8) + 0x58) + 0x60),
     plVar1 != (long *)0x0)) {
    (**(code **)(*plVar1 + 0xa0))();
  }
  return true;
}

Assistant:

bool QWindowSystemHelper<QWindowSystemInterface::AsynchronousDelivery>::handleEvent(Args ...args)
{
    QWindowSystemInterfacePrivate::windowSystemEventQueue.append(new EventType(args...));
    if (QAbstractEventDispatcher *dispatcher = QGuiApplicationPrivate::qt_qpa_core_dispatcher())
        dispatcher->wakeUp();
    return true;
}